

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvParticle_dns.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  N_Vector y_00;
  N_Vector e_00;
  N_Vector y_01;
  sunrealtype t_00;
  N_Vector e_01;
  FILE *YFID_00;
  FILE *EFID;
  FILE *YFID;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector e;
  sunrealtype *ydata;
  N_Vector y;
  void *cvode_mem;
  SUNContext sunctx;
  UserData udata;
  sunrealtype ec;
  sunrealtype tout;
  sunrealtype dtout;
  sunrealtype t;
  int totalout;
  int out;
  int retval;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  FILE *__stream;
  FILE *__stream_00;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  double local_38;
  double local_30;
  undefined8 local_28;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_18 = 0;
  local_1c = 0;
  local_28 = 0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0;
  local_48 = (void *)0x0;
  local_50 = 0;
  __stream_00 = (FILE *)0x0;
  __stream = (FILE *)0x0;
  local_14 = SUNContext_Create(0,&local_50);
  iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
  if (iVar1 == 0) {
    local_48 = malloc(0x38);
    iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
    if (iVar1 == 0) {
      local_14 = InitUserData(&__stream_00->_flags,(char ***)__stream,
                              (UserData)
                              CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
      if (iVar1 == 0) {
        y_00 = (N_Vector)N_VNew_Serial(2,local_50);
        iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
        if (iVar1 == 0) {
          e_00 = (N_Vector)N_VGetArrayPointer(y_00);
          e_00->content = (void *)0x3ff0000000000000;
          e_00->ops = (N_Vector_Ops)0x0;
          y_01 = (N_Vector)N_VClone(y_00);
          iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
          if (iVar1 == 0) {
            N_VConst(0,y_01);
            t_00 = (sunrealtype)CVodeCreate(2,local_50);
            iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
            if (iVar1 == 0) {
              local_14 = CVodeInit(local_28,t_00,f,y_00);
              iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
              if (iVar1 == 0) {
                local_14 = CVodeSetUserData(t_00,local_48);
                iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
                if (iVar1 == 0) {
                  local_14 = CVodeSStolerances(*(undefined8 *)((long)local_48 + 0x18),
                                               *(undefined8 *)((long)local_48 + 0x20),t_00);
                  iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
                  if (iVar1 == 0) {
                    e_01 = (N_Vector)SUNDenseMatrix(2,2,local_50);
                    iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
                    if (iVar1 == 0) {
                      YFID_00 = (FILE *)SUNLinSol_Dense(y_00,e_01,local_50);
                      iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c);
                      if (iVar1 == 0) {
                        local_14 = CVodeSetLinearSolver(t_00,YFID_00,e_01);
                        iVar1 = check_retval(__stream_00,(char *)__stream,in_stack_ffffffffffffff6c)
                        ;
                        if (iVar1 == 0) {
                          local_14 = CVodeSetJacFn(t_00,Jac);
                          iVar1 = check_retval(__stream_00,(char *)__stream,
                                               in_stack_ffffffffffffff6c);
                          if (iVar1 == 0) {
                            if (*(int *)((long)local_48 + 0x28) != 0) {
                              local_14 = CVodeSetProjFn(t_00,Proj);
                              iVar1 = check_retval(__stream_00,(char *)__stream,
                                                   in_stack_ffffffffffffff6c);
                              if (iVar1 != 0) {
                                return 1;
                              }
                              local_14 = CVodeSetProjErrEst(t_00,*(undefined4 *)
                                                                  ((long)local_48 + 0x2c));
                              iVar1 = check_retval(__stream_00,(char *)__stream,
                                                   in_stack_ffffffffffffff6c);
                              if (iVar1 != 0) {
                                return 1;
                              }
                            }
                            local_14 = CVodeSetMaxNumSteps(t_00,100000);
                            iVar1 = check_retval(__stream_00,(char *)__stream,
                                                 in_stack_ffffffffffffff6c);
                            if (iVar1 == 0) {
                              local_14 = PrintUserData((UserData)
                                                       CONCAT44(in_stack_ffffffffffffff6c,
                                                                in_stack_ffffffffffffff68));
                              iVar1 = check_retval(__stream_00,(char *)__stream,
                                                   in_stack_ffffffffffffff6c);
                              if (iVar1 == 0) {
                                printf("\n     t            x              y");
                                printf("             err x          err y       err constr\n");
                                WriteOutput(t_00,y_00,e_00,(sunrealtype)y_01,
                                            (int)((ulong)e_01 >> 0x20),YFID_00,(FILE *)__stream_00);
                                if (0 < *(int *)((long)local_48 + 0x34)) {
                                  __stream_00 = fopen("cvParticle_solution.txt","w");
                                  __stream = fopen("cvParticle_error.txt","w");
                                  WriteOutput(t_00,y_00,e_00,(sunrealtype)y_01,
                                              (int)((ulong)e_01 >> 0x20),YFID_00,(FILE *)__stream_00
                                             );
                                }
                                if (*(int *)((long)local_48 + 0x34) < 1) {
                                  local_1c = 1;
                                  local_30 = *(double *)((long)local_48 + 0x10) *
                                             (double)*(int *)((long)local_48 + 8);
                                }
                                else {
                                  local_1c = *(int *)((long)local_48 + 8) *
                                             *(int *)((long)local_48 + 0x34);
                                  local_30 = *(double *)((long)local_48 + 0x10) /
                                             (double)*(int *)((long)local_48 + 0x34);
                                }
                                local_38 = local_30;
                                for (local_18 = 0; local_18 < local_1c; local_18 = local_18 + 1) {
                                  if ((*(int *)((long)local_48 + 0x30) != 0) ||
                                     (*(int *)((long)local_48 + 0x34) == 0)) {
                                    local_14 = CVodeSetStopTime(local_38,t_00);
                                    iVar1 = check_retval(__stream_00,(char *)__stream,
                                                         in_stack_ffffffffffffff6c);
                                    if (iVar1 != 0) {
                                      return 1;
                                    }
                                  }
                                  local_14 = CVode(local_38,t_00,y_00,&local_28,1);
                                  iVar1 = check_retval(__stream_00,(char *)__stream,
                                                       in_stack_ffffffffffffff6c);
                                  if (iVar1 != 0) break;
                                  if (0 < *(int *)((long)local_48 + 0x34)) {
                                    local_14 = ComputeError((sunrealtype)e_00,y_01,e_01,
                                                            (sunrealtype *)YFID_00,
                                                            (UserData)__stream_00);
                                    iVar1 = check_retval(__stream_00,(char *)__stream,
                                                         in_stack_ffffffffffffff6c);
                                    if (iVar1 != 0) break;
                                    WriteOutput(t_00,y_00,e_00,(sunrealtype)y_01,
                                                (int)((ulong)e_01 >> 0x20),YFID_00,
                                                (FILE *)__stream_00);
                                    iVar1 = check_retval(__stream_00,(char *)__stream,
                                                         in_stack_ffffffffffffff6c);
                                    if (iVar1 != 0) break;
                                  }
                                  if (local_18 < local_1c + -1) {
                                    local_38 = local_30 + local_38;
                                  }
                                  else {
                                    local_38 = *(double *)((long)local_48 + 0x10) *
                                               (double)*(int *)((long)local_48 + 8);
                                  }
                                }
                                if (0 < *(int *)((long)local_48 + 0x34)) {
                                  fclose(__stream_00);
                                  fclose(__stream);
                                }
                                ComputeError((sunrealtype)e_00,y_01,e_01,(sunrealtype *)YFID_00,
                                             (UserData)__stream_00);
                                iVar1 = check_retval(__stream_00,(char *)__stream,
                                                     in_stack_ffffffffffffff6c);
                                if (iVar1 == 0) {
                                  WriteOutput(t_00,y_00,e_00,(sunrealtype)y_01,
                                              (int)((ulong)e_01 >> 0x20),YFID_00,(FILE *)__stream_00
                                             );
                                  iVar1 = check_retval(__stream_00,(char *)__stream,
                                                       in_stack_ffffffffffffff6c);
                                  if (iVar1 == 0) {
                                    PrintStats(y_00);
                                    free(local_48);
                                    N_VDestroy(y_00);
                                    N_VDestroy(y_01);
                                    SUNMatDestroy(e_01);
                                    SUNLinSolFree(YFID_00);
                                    CVodeFree(&stack0xffffffffffffffa8);
                                    SUNContext_Free(&local_50);
                                    local_4 = 0;
                                  }
                                  else {
                                    local_4 = 1;
                                  }
                                }
                                else {
                                  local_4 = 1;
                                }
                              }
                              else {
                                local_4 = 1;
                              }
                            }
                            else {
                              local_4 = 1;
                            }
                          }
                          else {
                            local_4 = 1;
                          }
                        }
                        else {
                          local_4 = 1;
                        }
                      }
                      else {
                        local_4 = 1;
                      }
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[])
{
  int retval;               /* reusable return flag       */
  int out           = 0;    /* output counter             */
  int totalout      = 0;    /* output counter             */
  sunrealtype t     = ZERO; /* current integration time   */
  sunrealtype dtout = ZERO; /* output spacing             */
  sunrealtype tout  = ZERO; /* next output time           */
  sunrealtype ec    = ZERO; /* constraint error           */
  UserData udata    = NULL; /* user data structure        */

  SUNContext sunctx  = NULL; /* SUNDIALS context     */
  void* cvode_mem    = NULL; /* CVODE memory         */
  N_Vector y         = NULL; /* solution vector      */
  sunrealtype* ydata = NULL; /* solution vector data */
  N_Vector e         = NULL; /* error vector         */
  SUNMatrix A        = NULL; /* Jacobian matrix      */
  SUNLinearSolver LS = NULL; /* linear solver        */

  FILE* YFID = NULL; /* solution output file */
  FILE* EFID = NULL; /* error output file    */

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate and initialize user data structure */
  udata = (UserData)malloc(sizeof *udata);
  if (check_retval((void*)udata, "malloc", 0)) { return (1); }

  retval = InitUserData(&argc, &argv, udata);
  if (check_retval(&retval, "InitUserData", 1)) { return (1); }

  /* Create serial vector to store the solution */
  y = N_VNew_Serial(2, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Set initial contion */
  ydata    = N_VGetArrayPointer(y);
  ydata[0] = ONE;
  ydata[1] = ZERO;

  /* Create serial vector to store the solution error */
  e = N_VClone(y);
  if (check_retval((void*)y, "N_VClone", 0)) { return (1); }

  /* Set initial error */
  N_VConst(ZERO, e);

  /* Create CVODE memory */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Initialize CVODE */
  retval = CVodeInit(cvode_mem, f, t, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Attach user-defined data structure to CVODE */
  retval = CVodeSetUserData(cvode_mem, udata);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Set integration tolerances */
  retval = CVodeSStolerances(cvode_mem, udata->rtol, udata->atol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(2, 2, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver to CVODE */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Set a user-supplied Jacobian function */
  retval = CVodeSetJacFn(cvode_mem, Jac);
  if (check_retval(&retval, "CVodeSetJacFn", 1)) { return (1); }

  /* Set a user-supplied projection function */
  if (udata->proj)
  {
    retval = CVodeSetProjFn(cvode_mem, Proj);
    if (check_retval(&retval, "CVodeSetProjFn", 1)) { return (1); }

    retval = CVodeSetProjErrEst(cvode_mem, udata->projerr);
    if (check_retval(&retval, "CVodeSetProjErrEst", 1)) { return (1); }
  }

  /* Set max steps between outputs */
  retval = CVodeSetMaxNumSteps(cvode_mem, 100000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Output problem setup */
  retval = PrintUserData(udata);
  if (check_retval(&retval, "PrintUserData", 1)) { return (1); }

  /* Output initial condition */
  printf("\n     t            x              y");
  printf("             err x          err y       err constr\n");
  WriteOutput(t, y, e, ec, 0, NULL, NULL);

  if (udata->nout > 0)
  {
    YFID = fopen("cvParticle_solution.txt", "w");
    EFID = fopen("cvParticle_error.txt", "w");
    WriteOutput(t, y, e, ec, 1, YFID, EFID);
  }

  /* Integrate in time and periodically output the solution and error */
  if (udata->nout > 0)
  {
    totalout = udata->orbits * udata->nout;
    dtout    = udata->torbit / udata->nout;
  }
  else
  {
    totalout = 1;
    dtout    = udata->torbit * udata->orbits;
  }
  tout = dtout;

  for (out = 0; out < totalout; out++)
  {
    /* Stop at output time (do not interpolate output) */
    if (udata->tstop || udata->nout == 0)
    {
      retval = CVodeSetStopTime(cvode_mem, tout);
      if (check_retval(&retval, "CVodeSetStopTime", 1)) { return (1); }
    }

    /* Advance in time */
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }

    /* Output solution and error */
    if (udata->nout > 0)
    {
      retval = ComputeError(t, y, e, &ec, udata);
      if (check_retval(&retval, "ComputeError", 1)) { break; }

      WriteOutput(t, y, e, ec, 1, YFID, EFID);
      if (check_retval(&retval, "WriteOutput", 1)) { break; }
    }

    /* Update output time */
    if (out < totalout - 1) { tout += dtout; }
    else { tout = udata->torbit * udata->orbits; }
  }

  /* Close output files */
  if (udata->nout > 0)
  {
    fclose(YFID);
    fclose(EFID);
  }

  /* Output final solution and error to screen */
  ComputeError(t, y, e, &ec, udata);
  if (check_retval(&retval, "ComputeError", 1)) { return (1); }

  WriteOutput(t, y, e, ec, 0, NULL, NULL);
  if (check_retval(&retval, "WriteOutput", 1)) { return (1); }

  /* Print some final statistics */
  PrintStats(cvode_mem);

  /* Free memory */
  free(udata);
  N_VDestroy(y);
  N_VDestroy(e);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  CVodeFree(&cvode_mem);
  SUNContext_Free(&sunctx);

  return (0);
}